

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::expectError
          (GetErrorCase *this,GLenum error0,GLenum error1)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_3f8;
  GetNameFunc local_3e8;
  int local_3e0;
  Enum<int,_2UL> local_3d8;
  GetNameFunc local_3c8;
  int local_3c0;
  Enum<int,_2UL> local_3b8;
  MessageBuilder local_3a8;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  MessageBuilder local_1e8;
  allocator<char> local_51;
  string local_50;
  GLenum local_2c;
  TestLog *pTStack_28;
  GLenum result;
  TestLog *log;
  Functions *gl;
  GLenum error1_local;
  GLenum error0_local;
  GetErrorCase *this_local;
  
  gl._0_4_ = error1;
  gl._4_4_ = error0;
  _error1_local = this;
  pRVar2 = Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  log = (TestLog *)CONCAT44(extraout_var,iVar1);
  pTStack_28 = tcu::TestContext::getLog
                         ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  local_2c = (*(code *)log[0x100].m_log)();
  if ((local_2c != gl._4_4_) && (local_2c != (GLenum)gl)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Incorrect error was reported",&local_51);
    tcu::ResultCollector::addResult(&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,&local_50)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (gl._4_4_ == (GLenum)gl) {
      tcu::TestLog::operator<<(&local_1e8,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
      EVar4 = glu::getErrorStr(gl._4_4_);
      local_208 = EVar4.m_getName;
      local_200 = EVar4.m_value;
      local_1f8.m_getName = local_208;
      local_1f8.m_value = local_200;
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1e8,&local_1f8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [23])" was expected but got ");
      EVar4 = glu::getErrorStr(local_2c);
      local_228 = EVar4.m_getName;
      local_220 = EVar4.m_value;
      local_218.m_getName = local_228;
      local_218.m_value = local_220;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_218);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    }
    else {
      tcu::TestLog::operator<<(&local_3a8,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
      EVar4 = glu::getErrorStr(gl._4_4_);
      local_3c8 = EVar4.m_getName;
      local_3c0 = EVar4.m_value;
      local_3b8.m_getName = local_3c8;
      local_3b8.m_value = local_3c0;
      pMVar3 = tcu::MessageBuilder::operator<<(&local_3a8,&local_3b8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])" or ");
      EVar4 = glu::getErrorStr((GLenum)gl);
      local_3e8 = EVar4.m_getName;
      local_3e0 = EVar4.m_value;
      local_3d8.m_getName = local_3e8;
      local_3d8.m_value = local_3e0;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3d8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [23])" was expected but got ");
      EVar4 = glu::getErrorStr(local_2c);
      local_3f8.m_getName = EVar4.m_getName;
      local_3f8.m_value = EVar4.m_value;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3f8);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
    }
  }
  return;
}

Assistant:

void GetErrorCase::expectError (glw::GLenum error0, glw::GLenum error1)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const GLenum			result	= gl.getError();

	if (result != error0 && result != error1)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect error was reported");
		if (error0 == error1)
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		else
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " or "
				<< glu::getErrorStr(error1) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		return;
	}
}